

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGXMLScanner.cpp
# Opt level: O0

void __thiscall xercesc_4_0::IGXMLScanner::scanEndTag(IGXMLScanner *this,bool *gotData)

{
  XMLValidator *pXVar1;
  IdentityConstraintHandler *this_00;
  SchemaElementDecl *elem;
  XMLDocumentHandler *pXVar2;
  undefined8 uVar3;
  ValueStackOf<bool> *this_01;
  byte bVar4;
  bool bVar5;
  ModelTypes MVar6;
  uint uVar7;
  ValidatorType VVar8;
  int iVar9;
  GrammarType GVar10;
  XMLSize_t XVar11;
  XMLCh *pXVar12;
  ComplexTypeInfo *pCVar13;
  DatatypeValidator *pDVar14;
  XMLCh *text2;
  undefined4 extraout_var;
  QName *this_02;
  XMLSize_t XVar15;
  Grammar *pGVar16;
  RuntimeException *pRVar17;
  byte local_e1;
  uint local_64;
  bool local_4b;
  byte local_4a;
  byte local_49;
  bool isRoot;
  ulong uStack_48;
  bool res;
  XMLSize_t failure;
  DatatypeValidator *psviMemberType;
  XMLCh *elemName;
  StackElem *topElem;
  uint uriId;
  bool *local_18;
  bool *gotData_local;
  IGXMLScanner *this_local;
  
  *gotData = true;
  local_18 = gotData;
  gotData_local = (bool *)this;
  bVar5 = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  if (bVar5) {
    XMLScanner::emitError(&this->super_XMLScanner,MoreEndThanStartTags);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    pRVar17 = (RuntimeException *)__cxa_allocate_exception(0x30);
    RuntimeException::RuntimeException
              (pRVar17,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
               ,0x3ac,Scan_UnbalancedStartEnd,(this->super_XMLScanner).fMemoryManager);
    __cxa_throw(pRVar17,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
  }
  if (((this->super_XMLScanner).fDoNamespaces & 1U) == 0) {
    local_64 = (this->super_XMLScanner).fEmptyNamespaceId;
  }
  else {
    local_64 = ElemStack::getCurrentURI(&(this->super_XMLScanner).fElemStack);
  }
  topElem._0_4_ = local_64;
  elemName = (XMLCh *)0x0;
  psviMemberType = (DatatypeValidator *)0x0;
  if (this->fGrammarType == SchemaGrammarType) {
    psviMemberType =
         (DatatypeValidator *)
         ElemStack::getCurrentSchemaElemName(&(this->super_XMLScanner).fElemStack);
    elemName = (XMLCh *)ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
  }
  else {
    elemName = (XMLCh *)ElemStack::topElement(&(this->super_XMLScanner).fElemStack);
    psviMemberType =
         (DatatypeValidator *)XMLElementDecl::getFullName(((StackElem *)elemName)->fThisElement);
  }
  bVar5 = ReaderMgr::skippedStringLong(&(this->super_XMLScanner).fReaderMgr,(XMLCh *)psviMemberType)
  ;
  if (!bVar5) {
    XMLScanner::emitError
              (&this->super_XMLScanner,ExpectedEndOfTagX,(XMLCh *)psviMemberType,(XMLCh *)0x0,
               (XMLCh *)0x0,(XMLCh *)0x0);
    ReaderMgr::skipPastChar(&(this->super_XMLScanner).fReaderMgr,L'>');
    ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
    return;
  }
  XVar15 = *(XMLSize_t *)(elemName + 4);
  XVar11 = ReaderMgr::getCurrentReaderNum(&(this->super_XMLScanner).fReaderMgr);
  if (XVar15 != XVar11) {
    XMLScanner::emitError(&this->super_XMLScanner,PartialTagMarkupError);
  }
  ReaderMgr::skipPastSpaces(&(this->super_XMLScanner).fReaderMgr);
  bVar5 = ReaderMgr::skippedChar(&(this->super_XMLScanner).fReaderMgr,L'>');
  if (!bVar5) {
    pXVar12 = XMLElementDecl::getFullName(*(XMLElementDecl **)elemName);
    XMLScanner::emitError
              (&this->super_XMLScanner,UnterminatedEndTag,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,
               (XMLCh *)0x0);
  }
  if (this->fGrammarType == SchemaGrammarType) {
    bVar5 = ValueStackOf<bool>::pop(this->fErrorStack);
    (this->fPSVIElemContext).fErrorOccurred = bVar5;
    if ((((this->super_XMLScanner).fValidate & 1U) == 0) ||
       (bVar5 = XMLElementDecl::isDeclared(*(XMLElementDecl **)elemName), !bVar5)) {
      (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
      (this->fPSVIElemContext).fCurrentTypeInfo = (ComplexTypeInfo *)0x0;
      (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
    }
    else {
      pCVar13 = SchemaValidator::getCurrentTypeInfo
                          ((SchemaValidator *)(this->super_XMLScanner).fValidator);
      (this->fPSVIElemContext).fCurrentTypeInfo = pCVar13;
      if ((this->fPSVIElemContext).fCurrentTypeInfo == (ComplexTypeInfo *)0x0) {
        pDVar14 = SchemaValidator::getCurrentDatatypeValidator
                            ((SchemaValidator *)(this->super_XMLScanner).fValidator);
        (this->fPSVIElemContext).fCurrentDV = pDVar14;
      }
      else {
        (this->fPSVIElemContext).fCurrentDV = (DatatypeValidator *)0x0;
      }
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        pXVar12 = SchemaValidator::getNormalizedValue
                            ((SchemaValidator *)(this->super_XMLScanner).fValidator);
        (this->fPSVIElemContext).fNormalizedValue = pXVar12;
        bVar5 = XMLString::equals((this->fPSVIElemContext).fNormalizedValue,L"");
        if (bVar5) {
          (this->fPSVIElemContext).fNormalizedValue = (XMLCh *)0x0;
        }
      }
    }
  }
  failure = 0;
  if (((this->super_XMLScanner).fValidate & 1U) != 0) {
    if (((this->fGrammarType == DTDGrammarType) && ((*(byte *)((long)elemName + 0x41) & 1) != 0)) &&
       (MVar6 = DTDElementDecl::getModelType(*(DTDElementDecl **)elemName), MVar6 == Empty)) {
      pXVar1 = (this->super_XMLScanner).fValidator;
      pXVar12 = XMLElementDecl::getFullName(*(XMLElementDecl **)elemName);
      XMLValidator::emitError
                (pXVar1,EmptyElemHasContent,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    if (((this->fGrammarType == DTDGrammarType) && ((elemName[0x21] & L'\x01') != L'\0')) &&
       (MVar6 = DTDElementDecl::getModelType(*(DTDElementDecl **)elemName), MVar6 == Children)) {
      pXVar1 = (this->super_XMLScanner).fValidator;
      pXVar12 = XMLElementDecl::getFullName(*(XMLElementDecl **)elemName);
      XMLValidator::emitError
                (pXVar1,ElemChildrenHasInvalidWS,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
    }
    pXVar1 = (this->super_XMLScanner).fValidator;
    uVar7 = (*pXVar1->_vptr_XMLValidator[2])
                      (pXVar1,*(undefined8 *)elemName,*(undefined8 *)(elemName + 0x10),
                       *(undefined8 *)(elemName + 0xc),&stack0xffffffffffffffb8);
    local_49 = (byte)uVar7 & 1;
    if ((uVar7 & 1) == 0) {
      if (*(long *)(elemName + 0xc) == 0) {
        pXVar1 = (this->super_XMLScanner).fValidator;
        pXVar12 = (XMLCh *)(**(code **)(**(long **)elemName + 0x68))();
        XMLValidator::emitError
                  (pXVar1,EmptyNotValidForContent,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else if (uStack_48 < *(ulong *)(elemName + 0xc)) {
        pXVar1 = (this->super_XMLScanner).fValidator;
        pXVar12 = QName::getRawName(*(QName **)(*(long *)(elemName + 0x10) + uStack_48 * 8));
        text2 = (XMLCh *)(**(code **)(**(long **)elemName + 0x68))();
        XMLValidator::emitError
                  (pXVar1,ElementNotValidForContent,pXVar12,text2,(XMLCh *)0x0,(XMLCh *)0x0);
      }
      else {
        pXVar1 = (this->super_XMLScanner).fValidator;
        pXVar12 = (XMLCh *)(**(code **)(**(long **)elemName + 0x68))();
        XMLValidator::emitError
                  (pXVar1,NotEnoughElemsForCM,pXVar12,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0);
      }
    }
    if (this->fGrammarType == SchemaGrammarType) {
      bVar5 = SchemaValidator::getErrorOccurred
                        ((SchemaValidator *)(this->super_XMLScanner).fValidator);
      if (bVar5) {
        (this->fPSVIElemContext).fErrorOccurred = true;
      }
      else if (((this->fPSVIElemContext).fCurrentDV != (DatatypeValidator *)0x0) &&
              (VVar8 = DatatypeValidator::getType((this->fPSVIElemContext).fCurrentDV),
              VVar8 == Union)) {
        iVar9 = (*((this->super_XMLScanner).fValidationContext)->_vptr_ValidationContext[0xb])();
        failure = CONCAT44(extraout_var,iVar9);
      }
      if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
        bVar5 = SchemaValidator::getIsElemSpecified
                          ((SchemaValidator *)(this->super_XMLScanner).fValidator);
        (this->fPSVIElemContext).fIsSpecified = bVar5;
        if (((this->fPSVIElemContext).fIsSpecified & 1U) != 0) {
          pXVar12 = SchemaElementDecl::getDefaultValue(*(SchemaElementDecl **)elemName);
          (this->fPSVIElemContext).fNormalizedValue = pXVar12;
        }
      }
      bVar5 = toCheckIdentityConstraint(this);
      if (bVar5) {
        this_00 = this->fICHandler;
        elem = *(SchemaElementDecl **)elemName;
        pXVar12 = XMLBuffer::getRawBuffer(&this->fContent);
        IdentityConstraintHandler::deactivateContext
                  (this_00,elem,pXVar12,(this->super_XMLScanner).fValidationContext,
                   (this->fPSVIElemContext).fCurrentDV);
      }
    }
  }
  ElemStack::popTop(&(this->super_XMLScanner).fElemStack);
  local_4a = ElemStack::isEmpty(&(this->super_XMLScanner).fElemStack);
  if (this->fGrammarType == SchemaGrammarType) {
    if ((this->super_XMLScanner).fPSVIHandler != (PSVIHandler *)0x0) {
      endElementPSVI(this,*(SchemaElementDecl **)elemName,(DatatypeValidator *)failure);
    }
    SchemaValidator::clearDatatypeBuffer((SchemaValidator *)(this->super_XMLScanner).fValidator);
  }
  if ((this->super_XMLScanner).fDocHandler != (XMLDocumentHandler *)0x0) {
    if (this->fGrammarType == SchemaGrammarType) {
      if (*(int *)(elemName + 0x34) == -1) {
        XMLBuffer::reset(&(this->super_XMLScanner).fPrefixBuf);
      }
      else {
        XMLBuffer::set(&(this->super_XMLScanner).fPrefixBuf,(XMLCh *)psviMemberType,
                       (long)*(int *)(elemName + 0x34));
      }
    }
    else {
      this_02 = XMLElementDecl::getElementName(*(XMLElementDecl **)elemName);
      pXVar12 = QName::getPrefix(this_02);
      XMLBuffer::set(&(this->super_XMLScanner).fPrefixBuf,pXVar12);
    }
    uVar7 = (uint)topElem;
    bVar4 = local_4a;
    pXVar2 = (this->super_XMLScanner).fDocHandler;
    uVar3 = *(undefined8 *)elemName;
    pXVar12 = XMLBuffer::getRawBuffer(&(this->super_XMLScanner).fPrefixBuf);
    (*pXVar2->_vptr_XMLDocumentHandler[6])(pXVar2,uVar3,(ulong)uVar7,(ulong)(bVar4 & 1),pXVar12);
  }
  if ((this->fGrammarType != SchemaGrammarType) || ((local_4a & 1) != 0)) goto LAB_0034f453;
  this_01 = this->fErrorStack;
  XVar15 = ValueStackOf<bool>::size(this->fErrorStack);
  if (XVar15 == 0) {
LAB_0034f426:
    local_e1 = (this->fPSVIElemContext).fErrorOccurred;
  }
  else {
    bVar5 = ValueStackOf<bool>::pop(this->fErrorStack);
    local_e1 = 1;
    if (!bVar5) goto LAB_0034f426;
  }
  local_4b = (bool)(local_e1 & 1);
  ValueStackOf<bool>::push(this_01,&local_4b);
LAB_0034f453:
  *local_18 = (bool)((local_4a ^ 0xff) & 1);
  if ((*local_18 & 1U) != 0) {
    if (((this->super_XMLScanner).fDoNamespaces & 1U) != 0) {
      pGVar16 = ElemStack::getCurrentGrammar(&(this->super_XMLScanner).fElemStack);
      (this->super_XMLScanner).fGrammar = pGVar16;
      GVar10 = (*(((this->super_XMLScanner).fGrammar)->super_XSerializable)._vptr_XSerializable[5])
                         ();
      this->fGrammarType = GVar10;
      if ((this->fGrammarType == SchemaGrammarType) &&
         (uVar7 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xd])(),
         (uVar7 & 1) == 0)) {
        if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
          pRVar17 = (RuntimeException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    (pRVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                     ,0x4b6,Gen_NoSchemaValidator,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(pRVar17,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        (this->super_XMLScanner).fValidator = &this->fSchemaValidator->super_XMLValidator;
      }
      else if ((this->fGrammarType == DTDGrammarType) &&
              (uVar7 = (*((this->super_XMLScanner).fValidator)->_vptr_XMLValidator[0xc])(),
              (uVar7 & 1) == 0)) {
        if (((this->super_XMLScanner).fValidatorFromUser & 1U) != 0) {
          pRVar17 = (RuntimeException *)__cxa_allocate_exception(0x30);
          RuntimeException::RuntimeException
                    (pRVar17,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/IGXMLScanner.cpp"
                     ,0x4bd,Gen_NoDTDValidator,(this->super_XMLScanner).fMemoryManager);
          __cxa_throw(pRVar17,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
        }
        (this->super_XMLScanner).fValidator = &this->fDTDValidator->super_XMLValidator;
      }
      pXVar1 = (this->super_XMLScanner).fValidator;
      (*pXVar1->_vptr_XMLValidator[0xb])(pXVar1,(this->super_XMLScanner).fGrammar);
    }
    bVar5 = ElemStack::getValidationFlag(&(this->super_XMLScanner).fElemStack);
    (this->super_XMLScanner).fValidate = bVar5;
  }
  return;
}

Assistant:

void IGXMLScanner::scanEndTag(bool& gotData)
{
    //  Assume we will still have data until proven otherwise. It will only
    //  ever be false if this is the end of the root element.
    gotData = true;

    //  Check if the element stack is empty. If so, then this is an unbalanced
    //  element (i.e. more ends than starts, perhaps because of bad text
    //  causing one to be skipped.)
    if (fElemStack.isEmpty())
    {
        emitError(XMLErrs::MoreEndThanStartTags);
        fReaderMgr.skipPastChar(chCloseAngle);
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Scan_UnbalancedStartEnd, fMemoryManager);
    }

    //  Pop the stack of the element we are supposed to be ending. Remember
    //  that we don't own this. The stack just keeps them and reuses them.
    unsigned int uriId = (fDoNamespaces)
        ? fElemStack.getCurrentURI() : fEmptyNamespaceId;

    // these get initialized below
    const ElemStack::StackElem* topElem = 0;
    const XMLCh *elemName = 0;

    // Make sure that its the end of the element that we expect
    // special case for schema validation, whose element decls,
    // obviously don't contain prefix information
    if(fGrammarType == Grammar::SchemaGrammarType)
    {
        elemName = fElemStack.getCurrentSchemaElemName();
        topElem = fElemStack.topElement();
    }
    else
    {
        topElem = fElemStack.topElement();
        elemName = topElem->fThisElement->getFullName();
    }
    if (!fReaderMgr.skippedStringLong(elemName))
    {
        emitError
        (
            XMLErrs::ExpectedEndOfTagX
            , elemName
        );
        fReaderMgr.skipPastChar(chCloseAngle);
        fElemStack.popTop();
        return;
    }

    // Make sure we are back on the same reader as where we started
    if (topElem->fReaderNum != fReaderMgr.getCurrentReaderNum())
        emitError(XMLErrs::PartialTagMarkupError);

    // Skip optional whitespace
    fReaderMgr.skipPastSpaces();

    // Make sure we find the closing bracket
    if (!fReaderMgr.skippedChar(chCloseAngle))
    {
        emitError
        (
            XMLErrs::UnterminatedEndTag
            , topElem->fThisElement->getFullName()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        // reset error occurred
        fPSVIElemContext.fErrorOccurred = fErrorStack->pop();
        if (fValidate && topElem->fThisElement->isDeclared())
        {
            fPSVIElemContext.fCurrentTypeInfo = ((SchemaValidator*) fValidator)->getCurrentTypeInfo();
            if(!fPSVIElemContext.fCurrentTypeInfo)
                fPSVIElemContext.fCurrentDV = ((SchemaValidator*) fValidator)->getCurrentDatatypeValidator();
            else
                fPSVIElemContext.fCurrentDV = 0;
            if(fPSVIHandler)
            {
                fPSVIElemContext.fNormalizedValue = ((SchemaValidator*) fValidator)->getNormalizedValue();

                if (XMLString::equals(fPSVIElemContext.fNormalizedValue, XMLUni::fgZeroLenString))
                    fPSVIElemContext.fNormalizedValue = 0;
            }
        }
        else
        {
            fPSVIElemContext.fCurrentDV = 0;
            fPSVIElemContext.fCurrentTypeInfo = 0;
            fPSVIElemContext.fNormalizedValue = 0;
        }
    }

    //  If validation is enabled, then lets pass him the list of children and
    //  this element and let him validate it.
    DatatypeValidator* psviMemberType = 0;
    if (fValidate)
    {

       //
       // XML1.0-3rd
       // Validity Constraint:
       // The declaration matches EMPTY and the element has no content (not even
       // entity references, comments, PIs or white space).
       //
       if ( (fGrammarType == Grammar::DTDGrammarType) &&
            (topElem->fCommentOrPISeen)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Empty))
       {
           fValidator->emitError
               (
               XMLValid::EmptyElemHasContent
               , topElem->fThisElement->getFullName()
               );
       }

       //
       // XML1.0-3rd
       // Validity Constraint:
       //
       // The declaration matches children and the sequence of child elements
       // belongs to the language generated by the regular expression in the
       // content model, with optional white space, comments and PIs
       // (i.e. markup matching production [27] Misc) between the start-tag and
       // the first child element, between child elements, or between the last
       // child element and the end-tag.
       //
       // Note that
       //    a CDATA section containing only white space or
       //    a reference to an entity whose replacement text is character references
       //       expanding to white space do not match the nonterminal S, and hence
       //       cannot appear in these positions; however,
       //    a reference to an internal entity with a literal value consisting
       //       of character references expanding to white space does match S,
       //       since its replacement text is the white space resulting from expansion
       //       of the character references.
       //
       if ( (fGrammarType == Grammar::DTDGrammarType)  &&
            (topElem->fReferenceEscaped)               &&
            (((DTDElementDecl*) topElem->fThisElement)->getModelType() == DTDElementDecl::Children))
       {
           fValidator->emitError
               (
               XMLValid::ElemChildrenHasInvalidWS
               , topElem->fThisElement->getFullName()
               );
       }
        XMLSize_t failure;
        bool res = fValidator->checkContent
        (
            topElem->fThisElement
            , topElem->fChildren
            , topElem->fChildCount
            , &failure
        );

        if (!res)
        {
            //  One of the elements is not valid for the content. NOTE that
            //  if no children were provided but the content model requires
            //  them, it comes back with a zero value. But we cannot use that
            //  to index the child array in this case, and have to put out a
            //  special message.
            if (!topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::EmptyNotValidForContent
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else if (failure >= topElem->fChildCount)
            {
                fValidator->emitError
                (
                    XMLValid::NotEnoughElemsForCM
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
            else
            {
                fValidator->emitError
                (
                    XMLValid::ElementNotValidForContent
                    , topElem->fChildren[failure]->getRawName()
                    , topElem->fThisElement->getFormattedContentModel()
                );
            }
        }


        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (((SchemaValidator*) fValidator)->getErrorOccurred())
                fPSVIElemContext.fErrorOccurred = true;
            else if (fPSVIElemContext.fCurrentDV && fPSVIElemContext.fCurrentDV->getType() == DatatypeValidator::Union)
                psviMemberType = fValidationContext->getValidatingMemberType();

            if (fPSVIHandler)
            {
                fPSVIElemContext.fIsSpecified = ((SchemaValidator*) fValidator)->getIsElemSpecified();
                if(fPSVIElemContext.fIsSpecified)
                    fPSVIElemContext.fNormalizedValue = ((SchemaElementDecl *)topElem->fThisElement)->getDefaultValue();
            }

            // call matchers and de-activate context
            if (toCheckIdentityConstraint())
            {
                fICHandler->deactivateContext
                             (
                              (SchemaElementDecl *) topElem->fThisElement
                            , fContent.getRawBuffer()
                            , fValidationContext
                            , fPSVIElemContext.fCurrentDV
                             );
            }

        }
    }

    // QName dv needed topElem to resolve URIs on the checkContent
    fElemStack.popTop();

    // See if it was the root element, to avoid multiple calls below
    const bool isRoot = fElemStack.isEmpty();

    if (fGrammarType == Grammar::SchemaGrammarType)
    {
        if (fPSVIHandler)
        {
            endElementPSVI(
                (SchemaElementDecl*)topElem->fThisElement, psviMemberType);
        }
        // now we can reset the datatype buffer, since the
        // application has had a chance to copy the characters somewhere else
        ((SchemaValidator *)fValidator)->clearDatatypeBuffer();
    }

    // If we have a doc handler, tell it about the end tag
    if (fDocHandler)
    {
        if (fGrammarType == Grammar::SchemaGrammarType) {
            if (topElem->fPrefixColonPos != -1)
                fPrefixBuf.set(elemName, topElem->fPrefixColonPos);
            else
                fPrefixBuf.reset();
        }
        else {
            fPrefixBuf.set(topElem->fThisElement->getElementName()->getPrefix());
        }
        fDocHandler->endElement
        (
            *topElem->fThisElement
            , uriId
            , isRoot
            , fPrefixBuf.getRawBuffer()
        );
    }

    if (fGrammarType == Grammar::SchemaGrammarType) {
        if (!isRoot)
        {
            // update error information
            fErrorStack->push((fErrorStack->size() && fErrorStack->pop()) || fPSVIElemContext.fErrorOccurred);


        }
    }

    // If this was the root, then done with content
    gotData = !isRoot;

    if (gotData) {
        if (fDoNamespaces) {
            // Restore the grammar
            fGrammar = fElemStack.getCurrentGrammar();
            fGrammarType = fGrammar->getGrammarType();
            if (fGrammarType == Grammar::SchemaGrammarType && !fValidator->handlesSchema()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoSchemaValidator, fMemoryManager);
                else {
                    fValidator = fSchemaValidator;
                }
            }
            else if (fGrammarType == Grammar::DTDGrammarType && !fValidator->handlesDTD()) {
                if (fValidatorFromUser)
                    ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Gen_NoDTDValidator, fMemoryManager);
                else {
                    fValidator = fDTDValidator;
                }
            }

            fValidator->setGrammar(fGrammar);
        }

        // Restore the validation flag
        fValidate = fElemStack.getValidationFlag();
    }
}